

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_open(unqlite **ppDB,char *zFilename,uint iMode)

{
  unqlite_vfs *puVar1;
  sxi32 sVar2;
  int iVar3;
  unqlite *pDb;
  ulong uVar4;
  unqlite_kv_methods *pMethods;
  Pager *pPVar5;
  Page **__s;
  jx9 *pBackend;
  char *pcVar6;
  Pager *pPVar7;
  sxu32 SLen;
  void *pUserData;
  Pager *pPager;
  char *pcVar8;
  ProcRandomSeed xSeed;
  uint nByte;
  uint uVar9;
  uint uVar10;
  uint nLen;
  Pager *pPVar11;
  
  *ppDB = (unqlite *)0x0;
  sVar2 = unqliteCoreInitialize();
  if (sVar2 != 0) {
    return sVar2;
  }
  pDb = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator,0x118);
  if (pDb == (unqlite *)0x0) {
    return -1;
  }
  uVar4 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)(pDb->sMem).apPool + (uVar4 - 0x3c)) = 0;
    uVar4 = uVar4 + 4;
  } while (uVar4 < 0x114);
  uVar9 = 0x101;
  if (iMode != 0) {
    uVar9 = iMode;
  }
  SyMemBackendInitFromParent((SyMemBackend *)pDb,&sUnqlMPGlobal.sAllocator);
  (pDb->sErr).pBlob = (void *)0x0;
  (pDb->sErr).nByte = 0;
  (pDb->sErr).mByte = 0;
  (pDb->sErr).pAllocator = (SyMemBackend *)pDb;
  (pDb->sErr).nFlags = 0;
  puVar1 = sUnqlMPGlobal.pVfs;
  uVar10 = uVar9 & 0xfffffff7 | 0x44;
  if ((uVar9 & 0x10) == 0) {
    uVar10 = uVar9 & 0xfffffff7;
  }
  uVar9 = uVar10 | 2;
  if ((uVar10 & 3) != 0) {
    uVar9 = uVar10;
  }
  if ((uVar9 & 4) == 0) {
    if ((uVar9 & 1) == 0) {
      if ((uVar9 & 2) != 0) {
        uVar9 = uVar9 & 0xfffffef2;
      }
      uVar4 = (ulong)uVar9;
    }
    else {
      uVar4 = (ulong)(uVar9 & 0xfffffff1);
    }
  }
  else {
    uVar4 = (ulong)(uVar9 & 0xfffffef4 | 2);
  }
  if (((zFilename == (char *)0x0) || ((uVar4 & 0x80) != 0)) || (*zFilename == '\0')) {
LAB_0010ad48:
    pMethods = unqliteFindKVStore("mem",3);
    uVar4 = (ulong)((uint)uVar4 | 0x80);
LAB_0010ad60:
    if (pMethods == (unqlite_kv_methods *)0x0) {
      unqliteGenError(pDb,"Cannot install a default Key/Value storage engine");
      sVar2 = -0x11;
      goto LAB_0010b121;
    }
  }
  else {
    pcVar8 = zFilename + 2;
    do {
      pcVar6 = pcVar8;
      if (pcVar6[-1] == '\0') {
        pcVar6 = pcVar6 + -1;
        goto LAB_0010ace9;
      }
      if (*pcVar6 == '\0') goto LAB_0010ace9;
      if (pcVar6[1] == '\0') {
        pcVar6 = pcVar6 + 1;
        goto LAB_0010ace9;
      }
      pcVar8 = pcVar6 + 4;
    } while (pcVar6[2] != '\0');
    pcVar6 = pcVar6 + 2;
LAB_0010ace9:
    iVar3 = (int)pcVar6 - (int)zFilename;
    if (iVar3 == 8) {
      pcVar8 = ":memory:";
      SLen = 8;
LAB_0010ad16:
      sVar2 = SyStrnicmp(zFilename,pcVar8,SLen);
      if (sVar2 == 0) goto LAB_0010ad48;
    }
    else if (iVar3 == 5) {
      pcVar8 = ":mem:";
      SLen = 5;
      goto LAB_0010ad16;
    }
    pMethods = unqliteFindKVStore("hash",4);
    if (pMethods == (unqlite_kv_methods *)0x0) {
      pMethods = unqliteFindKVStore("btree",5);
      goto LAB_0010ad60;
    }
  }
  uVar10 = (uint)uVar4;
  uVar9 = 1;
  if ((uVar4 & 0x80) == 0) {
    uVar9 = (uint)(uVar4 >> 6) & 1;
  }
  if ((uVar4 & 0x80) == 0) {
    pcVar8 = zFilename;
    if (*zFilename != '\0') {
      pcVar6 = zFilename + 2;
      do {
        pcVar8 = pcVar6;
        if (pcVar8[-1] == '\0') {
          pcVar8 = pcVar8 + -1;
          goto LAB_0010ae31;
        }
        if (*pcVar8 == '\0') goto LAB_0010ae31;
        if (pcVar8[1] == '\0') {
          pcVar8 = pcVar8 + 1;
          goto LAB_0010ae31;
        }
        pcVar6 = pcVar8 + 4;
      } while (pcVar8[2] != '\0');
      pcVar8 = pcVar8 + 2;
    }
LAB_0010ae31:
    nLen = (int)pcVar8 - (int)zFilename;
    nByte = puVar1->mxPathname + nLen + 0x261;
    pPVar5 = (Pager *)SyMemBackendAlloc((SyMemBackend *)pDb,nByte);
    if (pPVar5 != (Pager *)0x0) {
      pPager = pPVar5;
      if (nByte != 0) {
        pPVar11 = (Pager *)((pPVar5->sPrng).s + ((ulong)nByte - 0x66));
        goto LAB_0010ae71;
      }
LAB_0010ae9d:
      pPager->pAllocator = (SyMemBackend *)pDb;
      pPager->pDb = pDb;
      (pDb->sDB).pPager = pPager;
      pPager->nSize = 0x80;
      __s = (Page **)SyMemBackendAlloc((SyMemBackend *)pDb,0x400);
      pPager->apHash = __s;
      sVar2 = -1;
      if (__s != (Page **)0x0) {
        xSeed = (ProcRandomSeed)0x0;
        memset(__s,0,0x400);
        pPager->is_mem = (uVar10 & 0x80) >> 7;
        pPager->no_jrnl = uVar9;
        pPager->is_rdonly = uVar10 & 1;
        pPager->iOpenFlags = uVar10;
        pPager->pVfs = puVar1;
        SyRandomnessInit(&pPager->sPrng,xSeed,pUserData);
        SyRandomness(&pPager->sPrng,&pPager->cksumInit,4);
        pPager->nCacheMax = 0xffffffff;
        if ((uVar4 & 0x80) == 0) {
          pPVar5 = pPager + 1;
          pPager->zFilename = (char *)pPVar5;
          if (puVar1->xFullPathname == (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0) {
LAB_0010af9f:
            pPVar11 = pPVar5;
            if (*(char *)&pPVar5->pAllocator != '\0') {
              pPVar7 = (Pager *)((long)&pPVar5->pAllocator + 2);
              do {
                pPVar11 = pPVar7;
                if (pPVar11[-1].field_0x25f == '\0') {
                  pPVar11 = (Pager *)&pPVar11[-1].field_0x25f;
                  goto LAB_0010afde;
                }
                if (*(char *)&pPVar11->pAllocator == '\0') goto LAB_0010afde;
                if (*(char *)((long)&pPVar11->pAllocator + 1) == '\0') {
                  pPVar11 = (Pager *)((long)&pPVar11->pAllocator + 1);
                  goto LAB_0010afde;
                }
                pPVar7 = (Pager *)((long)&pPVar11->pAllocator + 4);
              } while (*(char *)((long)&pPVar11->pAllocator + 2) != '\0');
              pPVar11 = (Pager *)((long)&pPVar11->pAllocator + 2);
            }
LAB_0010afde:
            nLen = (int)pPVar11 - (int)pPVar5;
          }
          else {
            iVar3 = (*puVar1->xFullPathname)
                              (puVar1,zFilename,puVar1->mxPathname + nLen,(char *)pPVar5);
            pPVar5 = (Pager *)pPager->zFilename;
            if (iVar3 == 0) goto LAB_0010af9f;
            SyMemcpy(zFilename,pPVar5,nLen);
            pPager->zFilename[nLen] = '\0';
          }
          pcVar8 = (char *)SyMemBackendAlloc(pPager->pAllocator,nLen + 0x12);
          pPager->zJournal = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0010b03f;
          SyMemcpy(pPager->zFilename,pcVar8,nLen);
          SyMemcpy("_unqlite_journal",pPager->zJournal + nLen,0x10);
          pPager->zJournal[(ulong)nLen + 0x10] = '\0';
        }
        sVar2 = unqlitePagerRegisterKvEngine(pPager,pMethods);
        if (sVar2 == 0) {
          uVar9 = (uint)(pPager->is_mem != 0);
          pPager->iState = uVar9 * 5;
          pPager->iLock = uVar9 << 2;
          (pDb->sDB).pJx9 = (jx9 *)0x0;
          if (sJx9MPGlobal.nMagic != 0xea1495ba) {
            if (sJx9MPGlobal.pVfs == (jx9_vfs *)0x0) {
              jx9_lib_config(6,&sUnixVfs);
            }
            if ((sJx9MPGlobal.sAllocator.pMethods == (SyMemMethods *)0x0) &&
               (sVar2 = jx9_lib_config(1,0), sVar2 != 0)) goto LAB_0010b121;
            sJx9MPGlobal.nMagic = 0xea1495ba;
          }
          pBackend = (jx9 *)SyMemBackendPoolAlloc(&sJx9MPGlobal.sAllocator,0x118);
          if (pBackend != (jx9 *)0x0) {
            memset(pBackend,0,0x118);
            pBackend->nMagic = 0xf874bcd7;
            sVar2 = SyMemBackendInitFromParent((SyMemBackend *)pBackend,&sJx9MPGlobal.sAllocator);
            if (sVar2 == 0) {
              (pBackend->xConf).sErrConsumer.pBlob = (void *)0x0;
              (pBackend->xConf).sErrConsumer.nByte = 0;
              (pBackend->xConf).sErrConsumer.mByte = 0;
              (pBackend->xConf).sErrConsumer.pAllocator = (SyMemBackend *)pBackend;
              (pBackend->xConf).sErrConsumer.nFlags = 0;
              (pBackend->xConf).xErr = jx9VmBlobConsumer;
              (pBackend->xConf).pErrData = &(pBackend->xConf).sErrConsumer;
              pBackend->pVfs = sJx9MPGlobal.pVfs;
              if (sJx9MPGlobal.pEngines != (jx9 *)0x0) {
                pBackend->pNext = sJx9MPGlobal.pEngines;
                (sJx9MPGlobal.pEngines)->pPrev = pBackend;
              }
              sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + 1;
              sJx9MPGlobal.pEngines = pBackend;
              (pDb->sDB).pJx9 = pBackend;
              if (sUnqlMPGlobal.pDB != (unqlite *)0x0) {
                pDb->pNext = sUnqlMPGlobal.pDB;
                (sUnqlMPGlobal.pDB)->pPrev = pDb;
              }
              sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + 1;
              sUnqlMPGlobal.pDB = pDb;
              pDb->nMagic = 0xdb7c2712;
              *ppDB = pDb;
              return 0;
            }
            SyMemBackendRelease((SyMemBackend *)pBackend);
            SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pBackend);
            goto LAB_0010b121;
          }
          goto LAB_0010b11b;
        }
      }
LAB_0010b03f:
      SyMemBackendFree((SyMemBackend *)pDb,pPager);
      goto LAB_0010b121;
    }
  }
  else {
    pPVar5 = (Pager *)SyMemBackendAlloc((SyMemBackend *)pDb,0x260);
    if (pPVar5 != (Pager *)0x0) {
      pPVar11 = pPVar5 + 1;
      nLen = 0;
      pPager = pPVar5;
LAB_0010ae71:
      do {
        *(undefined1 *)&pPVar5->pAllocator = 0;
        pPVar7 = (Pager *)((long)&pPVar5->pAllocator + 1);
        if (pPVar11 <= pPVar7) break;
        *(undefined1 *)&pPVar7->pAllocator = 0;
        pPVar7 = (Pager *)((long)&pPVar5->pAllocator + 2);
        if (pPVar11 <= pPVar7) break;
        *(undefined1 *)&pPVar7->pAllocator = 0;
        pPVar7 = (Pager *)((long)&pPVar5->pAllocator + 3);
        if (pPVar11 <= pPVar7) break;
        *(undefined1 *)&pPVar7->pAllocator = 0;
        pPVar5 = (Pager *)((long)&pPVar5->pAllocator + 4);
      } while (pPVar5 < pPVar11);
      goto LAB_0010ae9d;
    }
  }
LAB_0010b11b:
  sVar2 = -1;
LAB_0010b121:
  SyMemBackendRelease((SyMemBackend *)pDb);
  SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pDb);
  return sVar2;
}

Assistant:

int unqlite_open(unqlite **ppDB,const char *zFilename,unsigned int iMode)
{
	unqlite *pHandle;
	int rc;
#if defined(UNTRUST)
	if( ppDB == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	*ppDB = 0;
	/* One-time automatic library initialization */
	rc = unqliteCoreInitialize();
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Allocate a new database handle */
	pHandle = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator, sizeof(unqlite));
	if( pHandle == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pHandle,sizeof(unqlite));
	if( iMode < 1 ){
		/* Assume a read-only database */
		iMode = UNQLITE_OPEN_READONLY|UNQLITE_OPEN_MMAP;
	}
	/* Init the database */
	rc = unqliteInitDatabase(pHandle,&sUnqlMPGlobal.sAllocator,zFilename,iMode);
	if( rc != UNQLITE_OK ){
		goto Release;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	if( !(iMode & UNQLITE_OPEN_NOMUTEX) && (sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE) ){
		 /* Associate a recursive mutex with this instance */
		 pHandle->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pHandle->pMutex == 0 ){
			 rc = UNQLITE_NOMEM;
			 goto Release;
		 }
	 }
#endif
	/* Link to the list of active DB handles */
#if defined(UNQLITE_ENABLE_THREADS)
	/* Enter the global mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	 MACRO_LD_PUSH(sUnqlMPGlobal.pDB,pHandle);
	 sUnqlMPGlobal.nDB++;
#if defined(UNQLITE_ENABLE_THREADS)
	/* Leave the global mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	/* Set the magic number to identify a valid DB handle */
	 pHandle->nMagic = UNQLITE_DB_MAGIC;
	/* Make the handle available to the caller */
	*ppDB = pHandle;
	return UNQLITE_OK;
Release:
	SyMemBackendRelease(&pHandle->sMem);
	SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pHandle);
	return rc;
}